

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlcdnumber.cpp
# Opt level: O3

void __thiscall
QLCDNumberPrivate::drawDigit
          (QLCDNumberPrivate *this,QPoint *pos,QPainter *p,int segLen,char newCh,char oldCh)

{
  bool erase;
  char *pcVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  char updates [18] [2];
  undefined8 local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined4 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = 0xaaaaaaaa;
  pcVar1 = getSegments(oldCh);
  cVar2 = *pcVar1;
  uVar9 = 0;
  if (cVar2 != 'c') {
    uVar9 = 0;
    do {
      *(undefined1 *)((long)&local_68 + uVar9 * 2) = 0;
      *(char *)((long)&local_68 + uVar9 * 2 + 1) = cVar2;
      cVar2 = pcVar1[uVar9 + 1];
      uVar9 = uVar9 + 1;
    } while (cVar2 != 'c');
  }
  pcVar1 = getSegments(newCh);
  cVar2 = *pcVar1;
  uVar8 = (uint)uVar9;
  uVar4 = uVar8;
  if (cVar2 != 'c') {
    lVar6 = 0;
    uVar5 = uVar9 & 0xffffffff;
    do {
      uVar7 = 0;
      if (uVar8 == 0) {
LAB_00415277:
        if ((uint)uVar7 == uVar8) goto LAB_0041527c;
      }
      else {
        uVar7 = 0;
        do {
          if (cVar2 == *(char *)((long)&local_68 + uVar7 * 2 + 1)) {
            *(undefined1 *)((long)&local_68 + uVar7 * 2) = 2;
            goto LAB_00415277;
          }
          uVar7 = uVar7 + 1;
        } while ((uVar9 & 0xffffffff) != uVar7);
LAB_0041527c:
        iVar3 = (int)uVar5;
        *(undefined1 *)((long)&local_68 + (long)iVar3 * 2) = 1;
        *(char *)((long)&local_68 + (long)iVar3 * 2 + 1) = cVar2;
        uVar5 = (ulong)(iVar3 + 1);
      }
      cVar2 = pcVar1[lVar6 + 1];
      lVar6 = lVar6 + 1;
      uVar4 = (uint)uVar5;
    } while (cVar2 != 'c');
  }
  if (0 < (int)uVar4) {
    uVar9 = 0;
    do {
      cVar2 = *(char *)((long)&local_68 + uVar9 * 2);
      if (cVar2 == '\x01') {
        erase = false;
LAB_004152b4:
        drawSegment(this,pos,*(char *)((long)&local_68 + uVar9 * 2 + 1),p,segLen,erase);
      }
      else if (cVar2 == '\0') {
        erase = true;
        goto LAB_004152b4;
      }
      uVar9 = uVar9 + 1;
    } while (uVar4 != uVar9);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLCDNumberPrivate::drawDigit(const QPoint &pos, QPainter &p, int segLen,
                                  char newCh, char oldCh)
{
// Draws and/or erases segments to change display of a single digit
// from oldCh to newCh

    char updates[18][2];        // can hold 2 times number of segments, only
                                // first 9 used if segment table is correct
    int  nErases;
    int  nUpdates;
    const char *segs;
    int  i,j;

    const char erase      = 0;
    const char draw       = 1;
    const char leaveAlone = 2;

    segs = getSegments(oldCh);
    for (nErases=0; segs[nErases] != 99; nErases++) {
        updates[nErases][0] = erase;            // get segments to erase to
        updates[nErases][1] = segs[nErases];    // remove old char
    }
    nUpdates = nErases;
    segs = getSegments(newCh);
    for(i = 0 ; segs[i] != 99 ; i++) {
        for (j=0;  j<nErases; j++)
            if (segs[i] == updates[j][1]) {   // same segment ?
                updates[j][0] = leaveAlone;     // yes, already on screen
                break;
            }
        if (j == nErases) {                   // if not already on screen
            updates[nUpdates][0] = draw;
            updates[nUpdates][1] = segs[i];
            nUpdates++;
        }
    }
    for (i=0; i<nUpdates; i++) {
        if (updates[i][0] == draw)
            drawSegment(pos, updates[i][1], p, segLen);
        if (updates[i][0] == erase)
            drawSegment(pos, updates[i][1], p, segLen, true);
    }
}